

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O0

void __thiscall
SStringViewRelational_Gt_Test<const_char_*>::TestBody
          (SStringViewRelational_Gt_Test<const_char_*> *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_820;
  Message local_818;
  bool local_809;
  char *local_808;
  bool local_7f9;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar_31;
  Message local_7e0;
  bool local_7d1;
  char *local_7d0;
  bool local_7c1;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar_30;
  raw_sstring_view lhs_view_15;
  Message local_798;
  bool local_789;
  char *local_788;
  bool local_779;
  undefined1 local_778 [8];
  AssertionResult gtest_ar_29;
  Message local_760;
  bool local_751;
  char *local_750;
  bool local_741;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_28;
  raw_sstring_view lhs_view_14;
  Message local_718;
  bool local_709;
  char *local_708;
  bool local_6f9;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_27;
  Message local_6e0;
  bool local_6d1;
  char *local_6d0;
  bool local_6c1;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_26;
  raw_sstring_view lhs_view_13;
  Message local_698;
  bool local_689;
  char *local_688;
  bool local_679;
  undefined1 local_678 [8];
  AssertionResult gtest_ar_25;
  Message local_660;
  bool local_651;
  char *local_650;
  bool local_641;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_24;
  raw_sstring_view lhs_view_12;
  Message local_618;
  bool local_609;
  char *local_608;
  bool local_5f9;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_23;
  Message local_5e0;
  bool local_5d1;
  char *local_5d0;
  bool local_5c1;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_22;
  raw_sstring_view lhs_view_11;
  Message local_598;
  bool local_589;
  char *local_588;
  bool local_579;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_21;
  Message local_560;
  bool local_551;
  char *local_550;
  bool local_541;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_20;
  raw_sstring_view lhs_view_10;
  Message local_518;
  bool local_509;
  char *local_508;
  bool local_4f9;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_19;
  Message local_4e0;
  bool local_4d1;
  char *local_4d0;
  bool local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_18;
  raw_sstring_view lhs_view_9;
  Message local_498;
  bool local_489;
  char *local_488;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_17;
  Message local_460;
  bool local_451;
  char *local_450;
  bool local_441;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_16;
  raw_sstring_view lhs_view_8;
  Message local_418;
  bool local_409;
  char *local_408;
  bool local_3f9;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_15;
  Message local_3e0;
  bool local_3d1;
  char *local_3d0;
  bool local_3c1;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_14;
  raw_sstring_view lhs_view_7;
  Message local_398;
  bool local_389;
  char *local_388;
  bool local_379;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_13;
  Message local_360;
  bool local_351;
  char *local_350;
  bool local_341;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_12;
  raw_sstring_view lhs_view_6;
  Message local_318;
  bool local_309;
  char *local_308;
  bool local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_11;
  Message local_2e0;
  bool local_2d1;
  char *local_2d0;
  bool local_2c1;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_10;
  raw_sstring_view lhs_view_5;
  Message local_298;
  bool local_289;
  char *local_288;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_9;
  Message local_260;
  bool local_251;
  char *local_250;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_8;
  raw_sstring_view lhs_view_4;
  Message local_218;
  bool local_209;
  char *local_208;
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_7;
  Message local_1e0;
  bool local_1d1;
  char *local_1d0;
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_6;
  raw_sstring_view lhs_view_3;
  Message local_198;
  bool local_189;
  char *local_188;
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_5;
  Message local_160;
  bool local_151;
  char *local_150;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_4;
  raw_sstring_view lhs_view_2;
  Message local_118;
  bool local_109;
  char *local_108;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  Message local_e0;
  bool local_d1;
  char *local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  raw_sstring_view lhs_view_1;
  Message local_98;
  bool local_89;
  char *local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_50;
  bool local_41;
  char *local_40;
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  raw_sstring_view lhs_view;
  SStringViewRelational_Gt_Test<const_char_*> *this_local;
  
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("",0);
  local_40 = "";
  local_31 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar.message_,&local_40);
  local_41 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_30,"lhs_view > (TypeParam (\"\"))","(false)",&local_31,&local_41);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1ce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_88 = "";
  local_79 = pstore::operator>(&local_88,(sstring_view<const_char_*> *)&gtest_ar.message_);
  local_89 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_78,"(TypeParam (\"\")) > lhs_view","(false)",&local_79,&local_89);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_1.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1ce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_1.size_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_1.size_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("",0);
  local_d0 = "abcde";
  local_c1 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_2.message_,&local_d0);
  local_d1 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_c0,"lhs_view > (TypeParam (\"abcde\"))","(false)",&local_c1,&local_d1
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1cf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_108 = "abcde";
  local_f9 = pstore::operator>(&local_108,(sstring_view<const_char_*> *)&gtest_ar_2.message_);
  local_109 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_f8,"(TypeParam (\"abcde\")) > lhs_view","(true)",&local_f9,&local_109
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_2.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1cf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_2.size_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_2.size_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("",0);
  local_150 = "abcdefghij";
  local_141 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_4.message_,&local_150);
  local_151 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_140,"lhs_view > (TypeParam (\"abcdefghij\"))","(false)",&local_141,
             &local_151);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_188 = "abcdefghij";
  local_179 = pstore::operator>(&local_188,(sstring_view<const_char_*> *)&gtest_ar_4.message_);
  local_189 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_178,"(TypeParam (\"abcdefghij\")) > lhs_view","(true)",&local_179,
             &local_189);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_3.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_3.size_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_3.size_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("",0);
  local_1d0 = "abcdefghijklmnopqrst";
  local_1c1 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_6.message_,&local_1d0);
  local_1d1 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_1c0,"lhs_view > (TypeParam (\"abcdefghijklmnopqrst\"))","(false)",
             &local_1c1,&local_1d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  local_208 = "abcdefghijklmnopqrst";
  local_1f9 = pstore::operator>(&local_208,(sstring_view<const_char_*> *)&gtest_ar_6.message_);
  local_209 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_1f8,"(TypeParam (\"abcdefghijklmnopqrst\")) > lhs_view","(true)",
             &local_1f9,&local_209);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_4.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_4.size_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_4.size_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcde",5);
  local_250 = "";
  local_241 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_8.message_,&local_250);
  local_251 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_240,"lhs_view > (TypeParam (\"\"))","(true)",&local_241,&local_251);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  local_288 = "";
  local_279 = pstore::operator>(&local_288,(sstring_view<const_char_*> *)&gtest_ar_8.message_);
  local_289 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_278,"(TypeParam (\"\")) > lhs_view","(false)",&local_279,&local_289);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_5.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_5.size_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_5.size_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcde",5);
  local_2d0 = "abcde";
  local_2c1 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_10.message_,&local_2d0);
  local_2d1 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_2c0,"lhs_view > (TypeParam (\"abcde\"))","(false)",&local_2c1,
             &local_2d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  local_308 = "abcde";
  local_2f9 = pstore::operator>(&local_308,(sstring_view<const_char_*> *)&gtest_ar_10.message_);
  local_309 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_2f8,"(TypeParam (\"abcde\")) > lhs_view","(false)",&local_2f9,
             &local_309);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_6.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_6.size_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_6.size_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcde",5);
  local_350 = "abcdefghij";
  local_341 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_12.message_,&local_350);
  local_351 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_340,"lhs_view > (TypeParam (\"abcdefghij\"))","(false)",&local_341,
             &local_351);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  local_388 = "abcdefghij";
  local_379 = pstore::operator>(&local_388,(sstring_view<const_char_*> *)&gtest_ar_12.message_);
  local_389 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_378,"(TypeParam (\"abcdefghij\")) > lhs_view","(true)",&local_379,
             &local_389);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_7.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_7.size_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_7.size_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcde",5);
  local_3d0 = "abcdefghijklmnopqrst";
  local_3c1 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_14.message_,&local_3d0);
  local_3d1 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_3c0,"lhs_view > (TypeParam (\"abcdefghijklmnopqrst\"))","(false)",
             &local_3c1,&local_3d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  local_408 = "abcdefghijklmnopqrst";
  local_3f9 = pstore::operator>(&local_408,(sstring_view<const_char_*> *)&gtest_ar_14.message_);
  local_409 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_3f8,"(TypeParam (\"abcdefghijklmnopqrst\")) > lhs_view","(true)",
             &local_3f9,&local_409);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_8.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_8.size_,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_8.size_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghij",10);
  local_450 = "";
  local_441 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_16.message_,&local_450);
  local_451 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_440,"lhs_view > (TypeParam (\"\"))","(true)",&local_441,&local_451);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  local_488 = "";
  local_479 = pstore::operator>(&local_488,(sstring_view<const_char_*> *)&gtest_ar_16.message_);
  local_489 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_478,"(TypeParam (\"\")) > lhs_view","(false)",&local_479,&local_489);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_9.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_9.size_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_9.size_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghij",10);
  local_4d0 = "abcde";
  local_4c1 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_18.message_,&local_4d0);
  local_4d1 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_4c0,"lhs_view > (TypeParam (\"abcde\"))","(true)",&local_4c1,
             &local_4d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  local_508 = "abcde";
  local_4f9 = pstore::operator>(&local_508,(sstring_view<const_char_*> *)&gtest_ar_18.message_);
  local_509 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_4f8,"(TypeParam (\"abcde\")) > lhs_view","(false)",&local_4f9,
             &local_509);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_10.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_10.size_,&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_10.size_);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghij",10);
  local_550 = "abcdefghij";
  local_541 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_20.message_,&local_550);
  local_551 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_540,"lhs_view > (TypeParam (\"abcdefghij\"))","(false)",&local_541,
             &local_551);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar1) {
    testing::Message::Message(&local_560);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_560);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  local_588 = "abcdefghij";
  local_579 = pstore::operator>(&local_588,(sstring_view<const_char_*> *)&gtest_ar_20.message_);
  local_589 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_578,"(TypeParam (\"abcdefghij\")) > lhs_view","(false)",&local_579,
             &local_589);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_578);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_11.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_11.size_,&local_598);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_11.size_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghij",10);
  local_5d0 = "abcdefghijklmnopqrst";
  local_5c1 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_22.message_,&local_5d0);
  local_5d1 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_5c0,"lhs_view > (TypeParam (\"abcdefghijklmnopqrst\"))","(false)",
             &local_5c1,&local_5d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  local_608 = "abcdefghijklmnopqrst";
  local_5f9 = pstore::operator>(&local_608,(sstring_view<const_char_*> *)&gtest_ar_22.message_);
  local_609 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_5f8,"(TypeParam (\"abcdefghijklmnopqrst\")) > lhs_view","(true)",
             &local_5f9,&local_609);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_618);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_12.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1d9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_12.size_,&local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_12.size_);
    testing::Message::~Message(&local_618);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghijklmnopqrst",0x14);
  local_650 = "";
  local_641 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_24.message_,&local_650);
  local_651 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_640,"lhs_view > (TypeParam (\"\"))","(true)",&local_641,&local_651);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(&local_660);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1da,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_660);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_660);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  local_688 = "";
  local_679 = pstore::operator>(&local_688,(sstring_view<const_char_*> *)&gtest_ar_24.message_);
  local_689 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_678,"(TypeParam (\"\")) > lhs_view","(false)",&local_679,&local_689);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar1) {
    testing::Message::Message(&local_698);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_678);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_13.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1da,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_13.size_,&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_13.size_);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghijklmnopqrst",0x14);
  local_6d0 = "abcde";
  local_6c1 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_26.message_,&local_6d0);
  local_6d1 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_6c0,"lhs_view > (TypeParam (\"abcde\"))","(true)",&local_6c1,
             &local_6d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1db,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
  local_708 = "abcde";
  local_6f9 = pstore::operator>(&local_708,(sstring_view<const_char_*> *)&gtest_ar_26.message_);
  local_709 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_6f8,"(TypeParam (\"abcde\")) > lhs_view","(false)",&local_6f9,
             &local_709);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar1) {
    testing::Message::Message(&local_718);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_14.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1db,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_14.size_,&local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_14.size_);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghijklmnopqrst",0x14);
  local_750 = "abcdefghij";
  local_741 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_28.message_,&local_750);
  local_751 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_740,"lhs_view > (TypeParam (\"abcdefghij\"))","(true)",&local_741,
             &local_751);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar1) {
    testing::Message::Message(&local_760);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1dc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_760);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  local_788 = "abcdefghij";
  local_779 = pstore::operator>(&local_788,(sstring_view<const_char_*> *)&gtest_ar_28.message_);
  local_789 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_778,"(TypeParam (\"abcdefghij\")) > lhs_view","(false)",&local_779,
             &local_789);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
  if (!bVar1) {
    testing::Message::Message(&local_798);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lhs_view_15.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1dc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lhs_view_15.size_,&local_798);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lhs_view_15.size_);
    testing::Message::~Message(&local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
  join_0x00000010_0x00000000_ = pstore::make_sstring_view("abcdefghijklmnopqrst",0x14);
  local_7d0 = "abcdefghijklmnopqrst";
  local_7c1 = pstore::operator>((sstring_view<const_char_*> *)&gtest_ar_30.message_,&local_7d0);
  local_7d1 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_7c0,"lhs_view > (TypeParam (\"abcdefghijklmnopqrst\"))","(false)",
             &local_7c1,&local_7d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar1) {
    testing::Message::Message(&local_7e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1dd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_7e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_7e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  local_808 = "abcdefghijklmnopqrst";
  local_7f9 = pstore::operator>(&local_808,(sstring_view<const_char_*> *)&gtest_ar_30.message_);
  local_809 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_7f8,"(TypeParam (\"abcdefghijklmnopqrst\")) > lhs_view","(false)",
             &local_7f9,&local_809);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
  if (!bVar1) {
    testing::Message::Message(&local_818);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_820,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x1dd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_820,&local_818);
    testing::internal::AssertHelper::~AssertHelper(&local_820);
    testing::Message::~Message(&local_818);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
  return;
}

Assistant:

TYPED_TEST (SStringViewRelational, Gt) {
#define GT(lhs, rhs, x, y)                                                                         \
    do {                                                                                           \
        auto const lhs_view = pstore::make_sstring_view ((lhs), std::strlen (lhs));                \
        EXPECT_EQ (lhs_view > (rhs), (x));                                                         \
        EXPECT_EQ ((rhs) > lhs_view, (y));                                                         \
    } while (0)
    GT ("", TypeParam (""), false, false);
    GT ("", TypeParam ("abcde"), false, true);
    GT ("", TypeParam ("abcdefghij"), false, true);
    GT ("", TypeParam ("abcdefghijklmnopqrst"), false, true);
    GT ("abcde", TypeParam (""), true, false);
    GT ("abcde", TypeParam ("abcde"), false, false);
    GT ("abcde", TypeParam ("abcdefghij"), false, true);
    GT ("abcde", TypeParam ("abcdefghijklmnopqrst"), false, true);
    GT ("abcdefghij", TypeParam (""), true, false);
    GT ("abcdefghij", TypeParam ("abcde"), true, false);
    GT ("abcdefghij", TypeParam ("abcdefghij"), false, false);
    GT ("abcdefghij", TypeParam ("abcdefghijklmnopqrst"), false, true);
    GT ("abcdefghijklmnopqrst", TypeParam (""), true, false);
    GT ("abcdefghijklmnopqrst", TypeParam ("abcde"), true, false);
    GT ("abcdefghijklmnopqrst", TypeParam ("abcdefghij"), true, false);
    GT ("abcdefghijklmnopqrst", TypeParam ("abcdefghijklmnopqrst"), false, false);
#undef GT
}